

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDatum.h
# Opt level: O2

VRDatumString * __thiscall MinVR::VRDatumPtr::stringVal(VRDatumPtr *this)

{
  VRError *this_00;
  allocator<char> local_a0;
  allocator<char> local_9f;
  allocator<char> local_9e;
  allocator<char> local_9d;
  int local_9c;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if (this->pData->type == VRCORETYPE_STRING) {
    return (VRDatumString *)this->pData;
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"This datum is not a VRString.",&local_9d);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_9e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDatum.h",
             &local_9f);
  local_9c = 0x272;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"VRDatumString *MinVR::VRDatumPtr::stringVal()",&local_a0);
  VRError::VRError(this_00,&local_38,&local_58,&local_78,&local_9c,&local_98);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

VRDatumString* stringVal()
  {
    if (pData->getType() == VRCORETYPE_STRING) {
      return static_cast<VRDatumString*>(pData);
    } else {
      VRERRORNOADV("This datum is not a VRString.");
    }
  }